

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O1

ptls_async_job_t *
async_sign_ctx_new(ptls_openssl_signature_scheme_t *scheme,EVP_MD_CTX *ctx,size_t siglen)

{
  ptls_async_job_t *ppVar1;
  _func_void_st_ptls_async_job_t_ptr__func_void_void_ptr_ptr_void_ptr *p_Var2;
  
  ppVar1 = (ptls_async_job_t *)malloc(siglen + 0x40);
  if (ppVar1 == (ptls_async_job_t *)0x0) {
    ppVar1 = (ptls_async_job_t *)0x0;
  }
  else {
    ppVar1->destroy_ = async_sign_ctx_free;
    ppVar1->get_fd = async_sign_ctx_get_fd;
    ppVar1->set_completion_callback =
         (_func_void_st_ptls_async_job_t_ptr__func_void_void_ptr_ptr_void_ptr *)0x0;
    ppVar1[1].destroy_ = (_func_void_st_ptls_async_job_t_ptr *)scheme;
    ppVar1[1].get_fd = (_func_int_st_ptls_async_job_t_ptr *)ctx;
    p_Var2 = (_func_void_st_ptls_async_job_t_ptr__func_void_void_ptr_ptr_void_ptr *)
             ASYNC_WAIT_CTX_new();
    ppVar1[1].set_completion_callback = p_Var2;
    ppVar1[2].destroy_ = (_func_void_st_ptls_async_job_t_ptr *)0x0;
    ppVar1[2].get_fd = (_func_int_st_ptls_async_job_t_ptr *)siglen;
    memset(&ppVar1[2].set_completion_callback,0,siglen);
  }
  return ppVar1;
}

Assistant:

static ptls_async_job_t *async_sign_ctx_new(const ptls_openssl_signature_scheme_t *scheme, EVP_MD_CTX *ctx, size_t siglen)
{
    struct async_sign_ctx *self;

    if ((self = malloc(offsetof(struct async_sign_ctx, sig) + siglen)) == NULL)
        return NULL;

    self->super = (ptls_async_job_t){async_sign_ctx_free, async_sign_ctx_get_fd};
    self->scheme = scheme;
    self->ctx = ctx;
    self->waitctx = ASYNC_WAIT_CTX_new();
    self->job = NULL;
    self->siglen = siglen;
    memset(self->sig, 0, siglen);

    return &self->super;
}